

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpRepeatedMessageOrGroup<false,false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort type_card;
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  FieldEntry *pFVar4;
  Nonnull<const_char_*> failure_msg;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  MessageLite *msg_00;
  ParseContext *pPVar5;
  ulong uVar6;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar7;
  uint *puVar8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar9;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *ctx_00;
  ParseContext *delta;
  int iVar10;
  uint32_t next_tag;
  uint local_6c;
  TcParseTableBase *local_68;
  MessageLite *local_60;
  uint64_t local_58;
  ParseContext *local_50 [2];
  undefined1 local_40 [8];
  ParseContext *local_38;
  
  local_68 = table;
  local_60 = msg;
  local_58 = hasbits;
  pFVar4 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                     (table,(ulong)data.field_0 >> 0x20);
  type_card = pFVar4->type_card;
  local_50[0] = (ParseContext *)(CONCAT44(local_50[0]._4_4_,(uint)type_card) & 0xffffffff00000030);
  local_6c = CONCAT22(local_6c._2_2_,0x20);
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<int,unsigned_short>
                          ((int *)local_50,(unsigned_short *)&local_6c,
                           "type_card & field_layout::kFcMask == static_cast<uint16_t>(field_layout::kFcRepeated)"
                          );
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_50[0] = (ParseContext *)(CONCAT44(local_50[0]._4_4_,(uint)type_card) & 0xffffffff000001c0)
    ;
    local_6c = local_6c & 0xffff0000;
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<int,unsigned_short>
                            ((int *)local_50,(unsigned_short *)&local_6c,
                             "type_card & field_layout::kRepMask == static_cast<uint16_t>(field_layout::kRepMessage)"
                            );
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      if ((data.field_0._0_4_ & 7) == 2) {
        local_38 = (ParseContext *)
                   RefAt<google::protobuf::internal::RepeatedPtrFieldBase>
                             (local_60,(ulong)pFVar4->offset);
        aVar9.data = (long)&local_68->has_bits_offset + (ulong)local_68->aux_offset;
        table_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   GetTableFromAux(type_card,*(FieldAux *)(aVar9.data + (ulong)pFVar4->aux_idx * 8))
        ;
        pPVar5 = (ParseContext *)ptr;
        do {
          delta = local_38;
          msg_00 = AddMessage((TcParseTableBase *)table_00,(RepeatedPtrFieldBase *)local_38);
          local_50[0] = pPVar5;
          uVar2 = ReadSize((char **)local_50);
          ctx_00 = local_50[0];
          if ((local_50[0] == (ParseContext *)0x0) || (ctx->depth_ < 1)) {
LAB_001edbaf:
            pcVar7 = Error(local_60,(char *)delta,ctx_00,(TcFieldData)aVar9,local_68,local_58);
            return pcVar7;
          }
          aVar9.data._4_4_ = 0;
          aVar9.data._0_4_ = uVar2;
          EpsCopyInputStream::PushLimit
                    ((EpsCopyInputStream *)&local_6c,(char *)ctx,(int)local_50[0]);
          uVar3 = local_6c;
          iVar10 = ctx->depth_ + -1;
          ctx->depth_ = iVar10;
          ctx_00 = extraout_RDX;
          delta = local_50[0];
          if (local_50[0] == (ParseContext *)0x0) goto LAB_001edbaf;
          aVar9 = table_00;
          ptr = ParseLoopPreserveNone(msg_00,(char *)local_50[0],ctx,(TcParseTableBase *)table_00);
          if ((ushort *)ptr != (ushort *)0x0) {
            failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                                    (iVar10,ctx->depth_,"old_depth == depth_");
            if (failure_msg != (Nullable<const_char_*>)0x0) {
              pcVar7 = 
              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
              ;
              iVar10 = 0x481;
              goto LAB_001edc44;
            }
          }
          ctx->depth_ = ctx->depth_ + 1;
          local_40._4_4_ = uVar3;
          delta = (ParseContext *)(local_40 + 4);
          bVar1 = EpsCopyInputStream::PopLimit(&ctx->super_EpsCopyInputStream,(LimitToken *)delta);
          ctx_00 = extraout_RDX_00;
          if ((!bVar1) || ((ushort *)ptr == (ushort *)0x0)) goto LAB_001edbaf;
          if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_001edbd1;
          delta = (ParseContext *)local_40;
          pPVar5 = (ParseContext *)ReadTag(ptr,(uint32_t *)delta,0);
          ctx_00 = extraout_RDX_01;
          if (pPVar5 == (ParseContext *)0x0) goto LAB_001edbaf;
        } while (local_40._0_4_ == data.field_0._0_4_);
        if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
LAB_001edbd1:
          if (local_68->has_bits_offset != 0) {
            puVar8 = RefAt<unsigned_int>(local_60,(ulong)local_68->has_bits_offset);
            *puVar8 = *puVar8 | (uint)local_58;
          }
          return (char *)(ushort *)ptr;
        }
        uVar3 = (uint)local_68->fast_idx_mask & (uint)*(ushort *)ptr;
        if ((uVar3 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        uVar6 = (ulong)(uVar3 & 0xfffffff8);
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((ulong)*(ushort *)ptr ^ *(ulong *)(&local_68[1].fast_idx_mask + uVar6 * 2));
        UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&local_68[1].has_bits_offset + uVar6);
      }
      else {
        UNRECOVERED_JUMPTABLE = local_68->fallback;
      }
      pcVar7 = (*UNRECOVERED_JUMPTABLE)(local_60,ptr,ctx,data,local_68,local_58);
      return pcVar7;
    }
    pcVar7 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
    ;
    iVar10 = 0xa1f;
  }
  else {
    pcVar7 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
    ;
    iVar10 = 0xa18;
  }
LAB_001edc44:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_50,pcVar7,iVar10,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_50);
}

Assistant:

const char* TcParser::MpRepeatedMessageOrGroup(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  ABSL_DCHECK_EQ(type_card & field_layout::kFcMask,
                 static_cast<uint16_t>(field_layout::kFcRepeated));
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Validate wiretype:
  if (!is_group) {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepMessage));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepGroup));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  RepeatedPtrFieldBase& field =
      MaybeCreateRepeatedRefAt<RepeatedPtrFieldBase, is_split>(
          base, entry.offset, msg);
  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));

  const char* ptr2 = ptr;
  uint32_t next_tag;
  do {
    MessageLite* value = AddMessage(inner_table, field);
    const auto inner_loop = [&](const char* ptr) {
      return ParseLoopPreserveNone(value, ptr, ctx, inner_table);
    };
    ptr = is_group ? ctx->ParseGroupInlined(ptr2, decoded_tag, inner_loop)
                   : ctx->ParseLengthDelimitedInlined(ptr2, inner_loop);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}